

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O0

void idct64_stage8_high48_sse2(__m128i *x,int32_t *cospi,__m128i __rounding,int8_t cos_bit)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined8 uVar93;
  undefined8 uVar94;
  undefined8 uVar95;
  undefined8 uVar96;
  undefined8 uVar97;
  undefined8 uVar98;
  uint uVar99;
  int iVar100;
  char in_DL;
  long in_RSI;
  long in_RDI;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  __m128i v1_7;
  __m128i v0_7;
  __m128i u1_7;
  __m128i u0_7;
  __m128i t1_7;
  __m128i t0_7;
  __m128i d1_6;
  __m128i d0_6;
  __m128i c1_6;
  __m128i c0_6;
  __m128i b1_6;
  __m128i b0_6;
  __m128i a1_6;
  __m128i a0_6;
  __m128i v1_6;
  __m128i v0_6;
  __m128i u1_6;
  __m128i u0_6;
  __m128i t1_6;
  __m128i t0_6;
  __m128i d1_5;
  __m128i d0_5;
  __m128i c1_5;
  __m128i c0_5;
  __m128i b1_5;
  __m128i b0_5;
  __m128i a1_5;
  __m128i a0_5;
  __m128i v1_5;
  __m128i v0_5;
  __m128i u1_5;
  __m128i u0_5;
  __m128i t1_5;
  __m128i t0_5;
  __m128i d1_4;
  __m128i d0_4;
  __m128i c1_4;
  __m128i c0_4;
  __m128i b1_4;
  __m128i b0_4;
  __m128i a1_4;
  __m128i a0_4;
  __m128i v1_4;
  __m128i v0_4;
  __m128i u1_4;
  __m128i u0_4;
  __m128i t1_4;
  __m128i t0_4;
  __m128i d1_3;
  __m128i d0_3;
  __m128i c1_3;
  __m128i c0_3;
  __m128i b1_3;
  __m128i b0_3;
  __m128i a1_3;
  __m128i a0_3;
  __m128i v1_3;
  __m128i v0_3;
  __m128i u1_3;
  __m128i u0_3;
  __m128i t1_3;
  __m128i t0_3;
  __m128i d1_2;
  __m128i d0_2;
  __m128i c1_2;
  __m128i c0_2;
  __m128i b1_2;
  __m128i b0_2;
  __m128i a1_2;
  __m128i a0_2;
  __m128i v1_2;
  __m128i v0_2;
  __m128i u1_2;
  __m128i u0_2;
  __m128i t1_2;
  __m128i t0_2;
  __m128i d1_1;
  __m128i d0_1;
  __m128i c1_1;
  __m128i c0_1;
  __m128i b1_1;
  __m128i b0_1;
  __m128i a1_1;
  __m128i a0_1;
  __m128i v1_1;
  __m128i v0_1;
  __m128i u1_1;
  __m128i u0_1;
  __m128i t1_1;
  __m128i t0_1;
  __m128i d1;
  __m128i d0;
  __m128i c1;
  __m128i c0;
  __m128i b1;
  __m128i b0;
  __m128i a1;
  __m128i a0;
  __m128i v1;
  __m128i v0;
  __m128i u1;
  __m128i u0;
  __m128i t1;
  __m128i t0;
  __m128i _in1_7;
  __m128i _in0_7;
  __m128i _in1_6;
  __m128i _in0_6;
  __m128i _in1_5;
  __m128i _in0_5;
  __m128i _in1_4;
  __m128i _in0_4;
  __m128i _in1_3;
  __m128i _in0_3;
  __m128i _in1_2;
  __m128i _in0_2;
  __m128i _in1_1;
  __m128i _in0_1;
  __m128i _in1;
  __m128i _in0;
  __m128i cospi_m48_m16;
  __m128i cospi_p48_p16;
  __m128i cospi_m16_p48;
  undefined2 local_1268;
  undefined2 uStack_1266;
  undefined2 uStack_1264;
  undefined2 uStack_1262;
  undefined2 local_1258;
  undefined2 uStack_1256;
  undefined2 uStack_1254;
  undefined2 uStack_1252;
  undefined2 local_1248;
  undefined2 uStack_1246;
  undefined2 uStack_1244;
  undefined2 uStack_1242;
  undefined2 local_1238;
  undefined2 uStack_1236;
  undefined2 uStack_1234;
  undefined2 uStack_1232;
  undefined2 local_1228;
  undefined2 uStack_1226;
  undefined2 uStack_1224;
  undefined2 uStack_1222;
  undefined2 local_1218;
  undefined2 uStack_1216;
  undefined2 uStack_1214;
  undefined2 uStack_1212;
  undefined2 local_1208;
  undefined2 uStack_1206;
  undefined2 uStack_1204;
  undefined2 uStack_1202;
  undefined2 local_11f8;
  undefined2 uStack_11f6;
  undefined2 uStack_11f4;
  undefined2 uStack_11f2;
  undefined2 local_11e8;
  undefined2 uStack_11e6;
  undefined2 uStack_11e4;
  undefined2 uStack_11e2;
  undefined2 local_11d8;
  undefined2 uStack_11d6;
  undefined2 uStack_11d4;
  undefined2 uStack_11d2;
  undefined2 local_11c8;
  undefined2 uStack_11c6;
  undefined2 uStack_11c4;
  undefined2 uStack_11c2;
  undefined2 local_11b8;
  undefined2 uStack_11b6;
  undefined2 uStack_11b4;
  undefined2 uStack_11b2;
  undefined2 local_11a8;
  undefined2 uStack_11a6;
  undefined2 uStack_11a4;
  undefined2 uStack_11a2;
  undefined2 local_1198;
  undefined2 uStack_1196;
  undefined2 uStack_1194;
  undefined2 uStack_1192;
  undefined2 local_1188;
  undefined2 uStack_1186;
  undefined2 uStack_1184;
  undefined2 uStack_1182;
  undefined2 local_1178;
  undefined2 uStack_1176;
  undefined2 uStack_1174;
  undefined2 uStack_1172;
  undefined2 uStack_1160;
  undefined2 uStack_115e;
  undefined2 uStack_115c;
  undefined2 uStack_115a;
  undefined2 uStack_1150;
  undefined2 uStack_114e;
  undefined2 uStack_114c;
  undefined2 uStack_114a;
  undefined2 uStack_1140;
  undefined2 uStack_113e;
  undefined2 uStack_113c;
  undefined2 uStack_113a;
  undefined2 uStack_1130;
  undefined2 uStack_112e;
  undefined2 uStack_112c;
  undefined2 uStack_112a;
  undefined2 uStack_1120;
  undefined2 uStack_111e;
  undefined2 uStack_111c;
  undefined2 uStack_111a;
  undefined2 uStack_1110;
  undefined2 uStack_110e;
  undefined2 uStack_110c;
  undefined2 uStack_110a;
  undefined2 uStack_1100;
  undefined2 uStack_10fe;
  undefined2 uStack_10fc;
  undefined2 uStack_10fa;
  undefined2 uStack_10f0;
  undefined2 uStack_10ee;
  undefined2 uStack_10ec;
  undefined2 uStack_10ea;
  undefined2 uStack_10e0;
  undefined2 uStack_10de;
  undefined2 uStack_10dc;
  undefined2 uStack_10da;
  undefined2 uStack_10d0;
  undefined2 uStack_10ce;
  undefined2 uStack_10cc;
  undefined2 uStack_10ca;
  undefined2 uStack_10c0;
  undefined2 uStack_10be;
  undefined2 uStack_10bc;
  undefined2 uStack_10ba;
  undefined2 uStack_10b0;
  undefined2 uStack_10ae;
  undefined2 uStack_10ac;
  undefined2 uStack_10aa;
  undefined2 uStack_10a0;
  undefined2 uStack_109e;
  undefined2 uStack_109c;
  undefined2 uStack_109a;
  undefined2 uStack_1090;
  undefined2 uStack_108e;
  undefined2 uStack_108c;
  undefined2 uStack_108a;
  undefined2 uStack_1080;
  undefined2 uStack_107e;
  undefined2 uStack_107c;
  undefined2 uStack_107a;
  undefined2 uStack_1070;
  undefined2 uStack_106e;
  undefined2 uStack_106c;
  undefined2 uStack_106a;
  undefined4 local_c58;
  undefined4 uStack_c54;
  undefined4 uStack_c50;
  undefined4 uStack_c4c;
  undefined4 local_c38;
  undefined4 uStack_c34;
  undefined4 uStack_c30;
  undefined4 uStack_c2c;
  undefined4 local_c18;
  undefined4 uStack_c14;
  undefined4 uStack_c10;
  undefined4 uStack_c0c;
  undefined4 local_bf8;
  undefined4 uStack_bf4;
  undefined4 uStack_bf0;
  undefined4 uStack_bec;
  undefined4 local_bd8;
  undefined4 uStack_bd4;
  undefined4 uStack_bd0;
  undefined4 uStack_bcc;
  undefined4 local_bb8;
  undefined4 uStack_bb4;
  undefined4 uStack_bb0;
  undefined4 uStack_bac;
  undefined4 local_b98;
  undefined4 uStack_b94;
  undefined4 uStack_b90;
  undefined4 uStack_b8c;
  undefined4 local_b78;
  undefined4 uStack_b74;
  undefined4 uStack_b70;
  undefined4 uStack_b6c;
  undefined4 local_b58;
  undefined4 uStack_b54;
  undefined4 uStack_b50;
  undefined4 uStack_b4c;
  undefined4 local_b38;
  undefined4 uStack_b34;
  undefined4 uStack_b30;
  undefined4 uStack_b2c;
  undefined4 local_b18;
  undefined4 uStack_b14;
  undefined4 uStack_b10;
  undefined4 uStack_b0c;
  undefined4 local_af8;
  undefined4 uStack_af4;
  undefined4 uStack_af0;
  undefined4 uStack_aec;
  undefined4 local_ad8;
  undefined4 uStack_ad4;
  undefined4 uStack_ad0;
  undefined4 uStack_acc;
  undefined4 local_ab8;
  undefined4 uStack_ab4;
  undefined4 uStack_ab0;
  undefined4 uStack_aac;
  undefined4 local_a98;
  undefined4 uStack_a94;
  undefined4 uStack_a90;
  undefined4 uStack_a8c;
  undefined4 local_a78;
  undefined4 uStack_a74;
  undefined4 uStack_a70;
  undefined4 uStack_a6c;
  undefined4 local_a58;
  undefined4 uStack_a54;
  undefined4 uStack_a50;
  undefined4 uStack_a4c;
  undefined4 local_a38;
  undefined4 uStack_a34;
  undefined4 uStack_a30;
  undefined4 uStack_a2c;
  undefined4 local_a18;
  undefined4 uStack_a14;
  undefined4 uStack_a10;
  undefined4 uStack_a0c;
  undefined4 local_9f8;
  undefined4 uStack_9f4;
  undefined4 uStack_9f0;
  undefined4 uStack_9ec;
  undefined4 local_9d8;
  undefined4 uStack_9d4;
  undefined4 uStack_9d0;
  undefined4 uStack_9cc;
  undefined4 local_9b8;
  undefined4 uStack_9b4;
  undefined4 uStack_9b0;
  undefined4 uStack_9ac;
  undefined4 local_998;
  undefined4 uStack_994;
  undefined4 uStack_990;
  undefined4 uStack_98c;
  undefined4 local_978;
  undefined4 uStack_974;
  undefined4 uStack_970;
  undefined4 uStack_96c;
  undefined4 local_958;
  undefined4 uStack_954;
  undefined4 uStack_950;
  undefined4 uStack_94c;
  undefined4 local_938;
  undefined4 uStack_934;
  undefined4 uStack_930;
  undefined4 uStack_92c;
  undefined4 local_918;
  undefined4 uStack_914;
  undefined4 uStack_910;
  undefined4 uStack_90c;
  undefined4 local_8f8;
  undefined4 uStack_8f4;
  undefined4 uStack_8f0;
  undefined4 uStack_8ec;
  undefined4 local_8d8;
  undefined4 uStack_8d4;
  undefined4 uStack_8d0;
  undefined4 uStack_8cc;
  undefined4 local_8b8;
  undefined4 uStack_8b4;
  undefined4 uStack_8b0;
  undefined4 uStack_8ac;
  undefined4 local_898;
  undefined4 uStack_894;
  undefined4 uStack_890;
  undefined4 uStack_88c;
  undefined4 local_888;
  undefined4 uStack_884;
  undefined4 uStack_880;
  undefined4 uStack_87c;
  undefined4 local_878;
  undefined4 uStack_874;
  undefined4 uStack_870;
  undefined4 uStack_86c;
  __m128i d1_7;
  __m128i d0_7;
  __m128i c1_7;
  __m128i c0_7;
  __m128i b1_7;
  __m128i b0_7;
  __m128i a1_7;
  __m128i a0_7;
  
  uVar99 = -*(int *)(in_RSI + 0x40) & 0xffffU | *(int *)(in_RSI + 0xc0) << 0x10;
  uVar93 = CONCAT44(uVar99,uVar99);
  uVar94 = CONCAT44(uVar99,uVar99);
  uVar99 = (uint)*(ushort *)(in_RSI + 0xc0) | *(int *)(in_RSI + 0x40) << 0x10;
  uVar95 = CONCAT44(uVar99,uVar99);
  uVar96 = CONCAT44(uVar99,uVar99);
  iVar100 = (-*(int *)(in_RSI + 0xc0) & 0xffffU) + *(int *)(in_RSI + 0x40) * -0x10000;
  uVar97 = CONCAT44(iVar100,iVar100);
  uVar98 = CONCAT44(iVar100,iVar100);
  auVar102 = *(undefined1 (*) [16])(in_RDI + 0x100);
  auVar101 = paddsw(*(undefined1 (*) [16])(in_RDI + 0x100),*(undefined1 (*) [16])(in_RDI + 0x170));
  *(undefined1 (*) [16])(in_RDI + 0x100) = auVar101;
  auVar102 = psubsw(auVar102,*(undefined1 (*) [16])(in_RDI + 0x170));
  *(undefined1 (*) [16])(in_RDI + 0x170) = auVar102;
  auVar102 = *(undefined1 (*) [16])(in_RDI + 0x110);
  auVar101 = paddsw(*(undefined1 (*) [16])(in_RDI + 0x110),*(undefined1 (*) [16])(in_RDI + 0x160));
  *(undefined1 (*) [16])(in_RDI + 0x110) = auVar101;
  auVar102 = psubsw(auVar102,*(undefined1 (*) [16])(in_RDI + 0x160));
  *(undefined1 (*) [16])(in_RDI + 0x160) = auVar102;
  auVar102 = *(undefined1 (*) [16])(in_RDI + 0x120);
  auVar101 = paddsw(*(undefined1 (*) [16])(in_RDI + 0x120),*(undefined1 (*) [16])(in_RDI + 0x150));
  *(undefined1 (*) [16])(in_RDI + 0x120) = auVar101;
  auVar102 = psubsw(auVar102,*(undefined1 (*) [16])(in_RDI + 0x150));
  *(undefined1 (*) [16])(in_RDI + 0x150) = auVar102;
  auVar102 = *(undefined1 (*) [16])(in_RDI + 0x130);
  auVar101 = paddsw(*(undefined1 (*) [16])(in_RDI + 0x130),*(undefined1 (*) [16])(in_RDI + 0x140));
  *(undefined1 (*) [16])(in_RDI + 0x130) = auVar101;
  auVar102 = psubsw(auVar102,*(undefined1 (*) [16])(in_RDI + 0x140));
  *(undefined1 (*) [16])(in_RDI + 0x140) = auVar102;
  auVar102 = *(undefined1 (*) [16])(in_RDI + 0x180);
  auVar101 = psubsw(*(undefined1 (*) [16])(in_RDI + 0x1f0),*(undefined1 (*) [16])(in_RDI + 0x180));
  *(undefined1 (*) [16])(in_RDI + 0x180) = auVar101;
  auVar102 = paddsw(*(undefined1 (*) [16])(in_RDI + 0x1f0),auVar102);
  *(undefined1 (*) [16])(in_RDI + 0x1f0) = auVar102;
  auVar102 = *(undefined1 (*) [16])(in_RDI + 400);
  auVar101 = psubsw(*(undefined1 (*) [16])(in_RDI + 0x1e0),*(undefined1 (*) [16])(in_RDI + 400));
  *(undefined1 (*) [16])(in_RDI + 400) = auVar101;
  auVar102 = paddsw(*(undefined1 (*) [16])(in_RDI + 0x1e0),auVar102);
  *(undefined1 (*) [16])(in_RDI + 0x1e0) = auVar102;
  auVar102 = *(undefined1 (*) [16])(in_RDI + 0x1a0);
  auVar101 = psubsw(*(undefined1 (*) [16])(in_RDI + 0x1d0),*(undefined1 (*) [16])(in_RDI + 0x1a0));
  *(undefined1 (*) [16])(in_RDI + 0x1a0) = auVar101;
  auVar102 = paddsw(*(undefined1 (*) [16])(in_RDI + 0x1d0),auVar102);
  *(undefined1 (*) [16])(in_RDI + 0x1d0) = auVar102;
  auVar102 = *(undefined1 (*) [16])(in_RDI + 0x1b0);
  auVar101 = psubsw(*(undefined1 (*) [16])(in_RDI + 0x1c0),*(undefined1 (*) [16])(in_RDI + 0x1b0));
  *(undefined1 (*) [16])(in_RDI + 0x1b0) = auVar101;
  auVar102 = paddsw(*(undefined1 (*) [16])(in_RDI + 0x1c0),auVar102);
  *(undefined1 (*) [16])(in_RDI + 0x1c0) = auVar102;
  uVar1 = *(undefined8 *)(in_RDI + 0x240);
  uVar2 = *(undefined8 *)(in_RDI + 0x3b0);
  local_1178 = (undefined2)uVar1;
  uStack_1176 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_1174 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_1172 = (undefined2)((ulong)uVar1 >> 0x30);
  local_1188 = (undefined2)uVar2;
  uStack_1186 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_1184 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_1182 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *(undefined8 *)(in_RDI + 0x248);
  uVar2 = *(undefined8 *)(in_RDI + 0x3b8);
  uStack_1070 = (undefined2)uVar1;
  uStack_106e = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_106c = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_106a = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_1080 = (undefined2)uVar2;
  uStack_107e = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_107c = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_107a = (undefined2)((ulong)uVar2 >> 0x30);
  auVar60._2_2_ = local_1188;
  auVar60._0_2_ = local_1178;
  auVar60._4_2_ = uStack_1176;
  auVar60._6_2_ = uStack_1186;
  auVar60._10_2_ = uStack_1184;
  auVar60._8_2_ = uStack_1174;
  auVar60._12_2_ = uStack_1172;
  auVar60._14_2_ = uStack_1182;
  auVar59._8_8_ = uVar94;
  auVar59._0_8_ = uVar93;
  auVar102 = pmaddwd(auVar60,auVar59);
  auVar58._2_2_ = uStack_1080;
  auVar58._0_2_ = uStack_1070;
  auVar58._4_2_ = uStack_106e;
  auVar58._6_2_ = uStack_107e;
  auVar58._10_2_ = uStack_107c;
  auVar58._8_2_ = uStack_106c;
  auVar58._12_2_ = uStack_106a;
  auVar58._14_2_ = uStack_107a;
  auVar57._8_8_ = uVar94;
  auVar57._0_8_ = uVar93;
  auVar101 = pmaddwd(auVar58,auVar57);
  auVar56._2_2_ = local_1188;
  auVar56._0_2_ = local_1178;
  auVar56._4_2_ = uStack_1176;
  auVar56._6_2_ = uStack_1186;
  auVar56._10_2_ = uStack_1184;
  auVar56._8_2_ = uStack_1174;
  auVar56._12_2_ = uStack_1172;
  auVar56._14_2_ = uStack_1182;
  auVar55._8_8_ = uVar96;
  auVar55._0_8_ = uVar95;
  auVar103 = pmaddwd(auVar56,auVar55);
  auVar54._2_2_ = uStack_1080;
  auVar54._0_2_ = uStack_1070;
  auVar54._4_2_ = uStack_106e;
  auVar54._6_2_ = uStack_107e;
  auVar54._10_2_ = uStack_107c;
  auVar54._8_2_ = uStack_106c;
  auVar54._12_2_ = uStack_106a;
  auVar54._14_2_ = uStack_107a;
  auVar53._8_8_ = uVar96;
  auVar53._0_8_ = uVar95;
  auVar104 = pmaddwd(auVar54,auVar53);
  local_878 = auVar102._0_4_;
  uStack_874 = auVar102._4_4_;
  uStack_870 = auVar102._8_4_;
  uStack_86c = auVar102._12_4_;
  local_888 = (int)in_XMM0_Qa;
  uStack_884 = (int)((ulong)in_XMM0_Qa >> 0x20);
  uStack_880 = (int)in_XMM0_Qb;
  uStack_87c = (int)((ulong)in_XMM0_Qb >> 0x20);
  local_898 = auVar101._0_4_;
  uStack_894 = auVar101._4_4_;
  uStack_890 = auVar101._8_4_;
  uStack_88c = auVar101._12_4_;
  local_8b8 = auVar103._0_4_;
  uStack_8b4 = auVar103._4_4_;
  uStack_8b0 = auVar103._8_4_;
  uStack_8ac = auVar103._12_4_;
  local_8d8 = auVar104._0_4_;
  uStack_8d4 = auVar104._4_4_;
  uStack_8d0 = auVar104._8_4_;
  uStack_8cc = auVar104._12_4_;
  auVar102 = ZEXT416((uint)(int)in_DL);
  auVar101 = ZEXT416((uint)(int)in_DL);
  auVar103 = ZEXT416((uint)(int)in_DL);
  auVar104 = ZEXT416((uint)(int)in_DL);
  auVar92._4_4_ = uStack_874 + uStack_884 >> auVar102;
  auVar92._0_4_ = local_878 + local_888 >> auVar102;
  auVar92._12_4_ = uStack_86c + uStack_87c >> auVar102;
  auVar92._8_4_ = uStack_870 + uStack_880 >> auVar102;
  auVar91._4_4_ = uStack_894 + uStack_884 >> auVar101;
  auVar91._0_4_ = local_898 + local_888 >> auVar101;
  auVar91._12_4_ = uStack_88c + uStack_87c >> auVar101;
  auVar91._8_4_ = uStack_890 + uStack_880 >> auVar101;
  auVar102 = packssdw(auVar92,auVar91);
  *(undefined1 (*) [16])(in_RDI + 0x240) = auVar102;
  auVar90._4_4_ = uStack_8b4 + uStack_884 >> auVar103;
  auVar90._0_4_ = local_8b8 + local_888 >> auVar103;
  auVar90._12_4_ = uStack_8ac + uStack_87c >> auVar103;
  auVar90._8_4_ = uStack_8b0 + uStack_880 >> auVar103;
  auVar89._4_4_ = uStack_8d4 + uStack_884 >> auVar104;
  auVar89._0_4_ = local_8d8 + local_888 >> auVar104;
  auVar89._12_4_ = uStack_8cc + uStack_87c >> auVar104;
  auVar89._8_4_ = uStack_8d0 + uStack_880 >> auVar104;
  auVar102 = packssdw(auVar90,auVar89);
  *(undefined1 (*) [16])(in_RDI + 0x3b0) = auVar102;
  uVar1 = *(undefined8 *)(in_RDI + 0x250);
  uVar2 = *(undefined8 *)(in_RDI + 0x3a0);
  local_1198 = (undefined2)uVar1;
  uStack_1196 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_1194 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_1192 = (undefined2)((ulong)uVar1 >> 0x30);
  local_11a8 = (undefined2)uVar2;
  uStack_11a6 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_11a4 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_11a2 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *(undefined8 *)(in_RDI + 600);
  uVar2 = *(undefined8 *)(in_RDI + 0x3a8);
  uStack_1090 = (undefined2)uVar1;
  uStack_108e = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_108c = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_108a = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_10a0 = (undefined2)uVar2;
  uStack_109e = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_109c = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_109a = (undefined2)((ulong)uVar2 >> 0x30);
  auVar52._2_2_ = local_11a8;
  auVar52._0_2_ = local_1198;
  auVar52._4_2_ = uStack_1196;
  auVar52._6_2_ = uStack_11a6;
  auVar52._10_2_ = uStack_11a4;
  auVar52._8_2_ = uStack_1194;
  auVar52._12_2_ = uStack_1192;
  auVar52._14_2_ = uStack_11a2;
  auVar51._8_8_ = uVar94;
  auVar51._0_8_ = uVar93;
  auVar102 = pmaddwd(auVar52,auVar51);
  auVar50._2_2_ = uStack_10a0;
  auVar50._0_2_ = uStack_1090;
  auVar50._4_2_ = uStack_108e;
  auVar50._6_2_ = uStack_109e;
  auVar50._10_2_ = uStack_109c;
  auVar50._8_2_ = uStack_108c;
  auVar50._12_2_ = uStack_108a;
  auVar50._14_2_ = uStack_109a;
  auVar49._8_8_ = uVar94;
  auVar49._0_8_ = uVar93;
  auVar101 = pmaddwd(auVar50,auVar49);
  auVar48._2_2_ = local_11a8;
  auVar48._0_2_ = local_1198;
  auVar48._4_2_ = uStack_1196;
  auVar48._6_2_ = uStack_11a6;
  auVar48._10_2_ = uStack_11a4;
  auVar48._8_2_ = uStack_1194;
  auVar48._12_2_ = uStack_1192;
  auVar48._14_2_ = uStack_11a2;
  auVar47._8_8_ = uVar96;
  auVar47._0_8_ = uVar95;
  auVar103 = pmaddwd(auVar48,auVar47);
  auVar46._2_2_ = uStack_10a0;
  auVar46._0_2_ = uStack_1090;
  auVar46._4_2_ = uStack_108e;
  auVar46._6_2_ = uStack_109e;
  auVar46._10_2_ = uStack_109c;
  auVar46._8_2_ = uStack_108c;
  auVar46._12_2_ = uStack_108a;
  auVar46._14_2_ = uStack_109a;
  auVar45._8_8_ = uVar96;
  auVar45._0_8_ = uVar95;
  auVar104 = pmaddwd(auVar46,auVar45);
  local_8f8 = auVar102._0_4_;
  uStack_8f4 = auVar102._4_4_;
  uStack_8f0 = auVar102._8_4_;
  uStack_8ec = auVar102._12_4_;
  local_918 = auVar101._0_4_;
  uStack_914 = auVar101._4_4_;
  uStack_910 = auVar101._8_4_;
  uStack_90c = auVar101._12_4_;
  local_938 = auVar103._0_4_;
  uStack_934 = auVar103._4_4_;
  uStack_930 = auVar103._8_4_;
  uStack_92c = auVar103._12_4_;
  local_958 = auVar104._0_4_;
  uStack_954 = auVar104._4_4_;
  uStack_950 = auVar104._8_4_;
  uStack_94c = auVar104._12_4_;
  auVar102 = ZEXT416((uint)(int)in_DL);
  auVar101 = ZEXT416((uint)(int)in_DL);
  auVar103 = ZEXT416((uint)(int)in_DL);
  auVar104 = ZEXT416((uint)(int)in_DL);
  auVar88._4_4_ = uStack_8f4 + uStack_884 >> auVar102;
  auVar88._0_4_ = local_8f8 + local_888 >> auVar102;
  auVar88._12_4_ = uStack_8ec + uStack_87c >> auVar102;
  auVar88._8_4_ = uStack_8f0 + uStack_880 >> auVar102;
  auVar87._4_4_ = uStack_914 + uStack_884 >> auVar101;
  auVar87._0_4_ = local_918 + local_888 >> auVar101;
  auVar87._12_4_ = uStack_90c + uStack_87c >> auVar101;
  auVar87._8_4_ = uStack_910 + uStack_880 >> auVar101;
  auVar102 = packssdw(auVar88,auVar87);
  *(undefined1 (*) [16])(in_RDI + 0x250) = auVar102;
  auVar86._4_4_ = uStack_934 + uStack_884 >> auVar103;
  auVar86._0_4_ = local_938 + local_888 >> auVar103;
  auVar86._12_4_ = uStack_92c + uStack_87c >> auVar103;
  auVar86._8_4_ = uStack_930 + uStack_880 >> auVar103;
  auVar85._4_4_ = uStack_954 + uStack_884 >> auVar104;
  auVar85._0_4_ = local_958 + local_888 >> auVar104;
  auVar85._12_4_ = uStack_94c + uStack_87c >> auVar104;
  auVar85._8_4_ = uStack_950 + uStack_880 >> auVar104;
  auVar102 = packssdw(auVar86,auVar85);
  *(undefined1 (*) [16])(in_RDI + 0x3a0) = auVar102;
  uVar1 = *(undefined8 *)(in_RDI + 0x260);
  uVar2 = *(undefined8 *)(in_RDI + 0x390);
  local_11b8 = (undefined2)uVar1;
  uStack_11b6 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_11b4 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_11b2 = (undefined2)((ulong)uVar1 >> 0x30);
  local_11c8 = (undefined2)uVar2;
  uStack_11c6 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_11c4 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_11c2 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *(undefined8 *)(in_RDI + 0x268);
  uVar2 = *(undefined8 *)(in_RDI + 0x398);
  uStack_10b0 = (undefined2)uVar1;
  uStack_10ae = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_10ac = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_10aa = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_10c0 = (undefined2)uVar2;
  uStack_10be = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_10bc = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_10ba = (undefined2)((ulong)uVar2 >> 0x30);
  auVar44._2_2_ = local_11c8;
  auVar44._0_2_ = local_11b8;
  auVar44._4_2_ = uStack_11b6;
  auVar44._6_2_ = uStack_11c6;
  auVar44._10_2_ = uStack_11c4;
  auVar44._8_2_ = uStack_11b4;
  auVar44._12_2_ = uStack_11b2;
  auVar44._14_2_ = uStack_11c2;
  auVar43._8_8_ = uVar94;
  auVar43._0_8_ = uVar93;
  auVar102 = pmaddwd(auVar44,auVar43);
  auVar42._2_2_ = uStack_10c0;
  auVar42._0_2_ = uStack_10b0;
  auVar42._4_2_ = uStack_10ae;
  auVar42._6_2_ = uStack_10be;
  auVar42._10_2_ = uStack_10bc;
  auVar42._8_2_ = uStack_10ac;
  auVar42._12_2_ = uStack_10aa;
  auVar42._14_2_ = uStack_10ba;
  auVar41._8_8_ = uVar94;
  auVar41._0_8_ = uVar93;
  auVar101 = pmaddwd(auVar42,auVar41);
  auVar40._2_2_ = local_11c8;
  auVar40._0_2_ = local_11b8;
  auVar40._4_2_ = uStack_11b6;
  auVar40._6_2_ = uStack_11c6;
  auVar40._10_2_ = uStack_11c4;
  auVar40._8_2_ = uStack_11b4;
  auVar40._12_2_ = uStack_11b2;
  auVar40._14_2_ = uStack_11c2;
  auVar39._8_8_ = uVar96;
  auVar39._0_8_ = uVar95;
  auVar103 = pmaddwd(auVar40,auVar39);
  auVar38._2_2_ = uStack_10c0;
  auVar38._0_2_ = uStack_10b0;
  auVar38._4_2_ = uStack_10ae;
  auVar38._6_2_ = uStack_10be;
  auVar38._10_2_ = uStack_10bc;
  auVar38._8_2_ = uStack_10ac;
  auVar38._12_2_ = uStack_10aa;
  auVar38._14_2_ = uStack_10ba;
  auVar37._8_8_ = uVar96;
  auVar37._0_8_ = uVar95;
  auVar104 = pmaddwd(auVar38,auVar37);
  local_978 = auVar102._0_4_;
  uStack_974 = auVar102._4_4_;
  uStack_970 = auVar102._8_4_;
  uStack_96c = auVar102._12_4_;
  local_998 = auVar101._0_4_;
  uStack_994 = auVar101._4_4_;
  uStack_990 = auVar101._8_4_;
  uStack_98c = auVar101._12_4_;
  local_9b8 = auVar103._0_4_;
  uStack_9b4 = auVar103._4_4_;
  uStack_9b0 = auVar103._8_4_;
  uStack_9ac = auVar103._12_4_;
  local_9d8 = auVar104._0_4_;
  uStack_9d4 = auVar104._4_4_;
  uStack_9d0 = auVar104._8_4_;
  uStack_9cc = auVar104._12_4_;
  auVar102 = ZEXT416((uint)(int)in_DL);
  auVar101 = ZEXT416((uint)(int)in_DL);
  auVar103 = ZEXT416((uint)(int)in_DL);
  auVar104 = ZEXT416((uint)(int)in_DL);
  auVar84._4_4_ = uStack_974 + uStack_884 >> auVar102;
  auVar84._0_4_ = local_978 + local_888 >> auVar102;
  auVar84._12_4_ = uStack_96c + uStack_87c >> auVar102;
  auVar84._8_4_ = uStack_970 + uStack_880 >> auVar102;
  auVar83._4_4_ = uStack_994 + uStack_884 >> auVar101;
  auVar83._0_4_ = local_998 + local_888 >> auVar101;
  auVar83._12_4_ = uStack_98c + uStack_87c >> auVar101;
  auVar83._8_4_ = uStack_990 + uStack_880 >> auVar101;
  auVar102 = packssdw(auVar84,auVar83);
  *(undefined1 (*) [16])(in_RDI + 0x260) = auVar102;
  auVar82._4_4_ = uStack_9b4 + uStack_884 >> auVar103;
  auVar82._0_4_ = local_9b8 + local_888 >> auVar103;
  auVar82._12_4_ = uStack_9ac + uStack_87c >> auVar103;
  auVar82._8_4_ = uStack_9b0 + uStack_880 >> auVar103;
  auVar81._4_4_ = uStack_9d4 + uStack_884 >> auVar104;
  auVar81._0_4_ = local_9d8 + local_888 >> auVar104;
  auVar81._12_4_ = uStack_9cc + uStack_87c >> auVar104;
  auVar81._8_4_ = uStack_9d0 + uStack_880 >> auVar104;
  auVar102 = packssdw(auVar82,auVar81);
  *(undefined1 (*) [16])(in_RDI + 0x390) = auVar102;
  uVar1 = *(undefined8 *)(in_RDI + 0x270);
  uVar2 = *(undefined8 *)(in_RDI + 0x380);
  local_11d8 = (undefined2)uVar1;
  uStack_11d6 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_11d4 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_11d2 = (undefined2)((ulong)uVar1 >> 0x30);
  local_11e8 = (undefined2)uVar2;
  uStack_11e6 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_11e4 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_11e2 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *(undefined8 *)(in_RDI + 0x278);
  uVar2 = *(undefined8 *)(in_RDI + 0x388);
  uStack_10d0 = (undefined2)uVar1;
  uStack_10ce = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_10cc = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_10ca = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_10e0 = (undefined2)uVar2;
  uStack_10de = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_10dc = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_10da = (undefined2)((ulong)uVar2 >> 0x30);
  auVar36._2_2_ = local_11e8;
  auVar36._0_2_ = local_11d8;
  auVar36._4_2_ = uStack_11d6;
  auVar36._6_2_ = uStack_11e6;
  auVar36._10_2_ = uStack_11e4;
  auVar36._8_2_ = uStack_11d4;
  auVar36._12_2_ = uStack_11d2;
  auVar36._14_2_ = uStack_11e2;
  auVar35._8_8_ = uVar94;
  auVar35._0_8_ = uVar93;
  auVar102 = pmaddwd(auVar36,auVar35);
  auVar34._2_2_ = uStack_10e0;
  auVar34._0_2_ = uStack_10d0;
  auVar34._4_2_ = uStack_10ce;
  auVar34._6_2_ = uStack_10de;
  auVar34._10_2_ = uStack_10dc;
  auVar34._8_2_ = uStack_10cc;
  auVar34._12_2_ = uStack_10ca;
  auVar34._14_2_ = uStack_10da;
  auVar33._8_8_ = uVar94;
  auVar33._0_8_ = uVar93;
  auVar101 = pmaddwd(auVar34,auVar33);
  auVar32._2_2_ = local_11e8;
  auVar32._0_2_ = local_11d8;
  auVar32._4_2_ = uStack_11d6;
  auVar32._6_2_ = uStack_11e6;
  auVar32._10_2_ = uStack_11e4;
  auVar32._8_2_ = uStack_11d4;
  auVar32._12_2_ = uStack_11d2;
  auVar32._14_2_ = uStack_11e2;
  auVar31._8_8_ = uVar96;
  auVar31._0_8_ = uVar95;
  auVar103 = pmaddwd(auVar32,auVar31);
  auVar30._2_2_ = uStack_10e0;
  auVar30._0_2_ = uStack_10d0;
  auVar30._4_2_ = uStack_10ce;
  auVar30._6_2_ = uStack_10de;
  auVar30._10_2_ = uStack_10dc;
  auVar30._8_2_ = uStack_10cc;
  auVar30._12_2_ = uStack_10ca;
  auVar30._14_2_ = uStack_10da;
  auVar29._8_8_ = uVar96;
  auVar29._0_8_ = uVar95;
  auVar104 = pmaddwd(auVar30,auVar29);
  local_9f8 = auVar102._0_4_;
  uStack_9f4 = auVar102._4_4_;
  uStack_9f0 = auVar102._8_4_;
  uStack_9ec = auVar102._12_4_;
  local_a18 = auVar101._0_4_;
  uStack_a14 = auVar101._4_4_;
  uStack_a10 = auVar101._8_4_;
  uStack_a0c = auVar101._12_4_;
  local_a38 = auVar103._0_4_;
  uStack_a34 = auVar103._4_4_;
  uStack_a30 = auVar103._8_4_;
  uStack_a2c = auVar103._12_4_;
  local_a58 = auVar104._0_4_;
  uStack_a54 = auVar104._4_4_;
  uStack_a50 = auVar104._8_4_;
  uStack_a4c = auVar104._12_4_;
  auVar102 = ZEXT416((uint)(int)in_DL);
  auVar101 = ZEXT416((uint)(int)in_DL);
  auVar103 = ZEXT416((uint)(int)in_DL);
  auVar104 = ZEXT416((uint)(int)in_DL);
  auVar80._4_4_ = uStack_9f4 + uStack_884 >> auVar102;
  auVar80._0_4_ = local_9f8 + local_888 >> auVar102;
  auVar80._12_4_ = uStack_9ec + uStack_87c >> auVar102;
  auVar80._8_4_ = uStack_9f0 + uStack_880 >> auVar102;
  auVar79._4_4_ = uStack_a14 + uStack_884 >> auVar101;
  auVar79._0_4_ = local_a18 + local_888 >> auVar101;
  auVar79._12_4_ = uStack_a0c + uStack_87c >> auVar101;
  auVar79._8_4_ = uStack_a10 + uStack_880 >> auVar101;
  auVar102 = packssdw(auVar80,auVar79);
  *(undefined1 (*) [16])(in_RDI + 0x270) = auVar102;
  auVar78._4_4_ = uStack_a34 + uStack_884 >> auVar103;
  auVar78._0_4_ = local_a38 + local_888 >> auVar103;
  auVar78._12_4_ = uStack_a2c + uStack_87c >> auVar103;
  auVar78._8_4_ = uStack_a30 + uStack_880 >> auVar103;
  auVar77._4_4_ = uStack_a54 + uStack_884 >> auVar104;
  auVar77._0_4_ = local_a58 + local_888 >> auVar104;
  auVar77._12_4_ = uStack_a4c + uStack_87c >> auVar104;
  auVar77._8_4_ = uStack_a50 + uStack_880 >> auVar104;
  auVar102 = packssdw(auVar78,auVar77);
  *(undefined1 (*) [16])(in_RDI + 0x380) = auVar102;
  uVar1 = *(undefined8 *)(in_RDI + 0x280);
  uVar2 = *(undefined8 *)(in_RDI + 0x370);
  local_11f8 = (undefined2)uVar1;
  uStack_11f6 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_11f4 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_11f2 = (undefined2)((ulong)uVar1 >> 0x30);
  local_1208 = (undefined2)uVar2;
  uStack_1206 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_1204 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_1202 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *(undefined8 *)(in_RDI + 0x288);
  uVar2 = *(undefined8 *)(in_RDI + 0x378);
  uStack_10f0 = (undefined2)uVar1;
  uStack_10ee = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_10ec = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_10ea = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_1100 = (undefined2)uVar2;
  uStack_10fe = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_10fc = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_10fa = (undefined2)((ulong)uVar2 >> 0x30);
  auVar28._2_2_ = local_1208;
  auVar28._0_2_ = local_11f8;
  auVar28._4_2_ = uStack_11f6;
  auVar28._6_2_ = uStack_1206;
  auVar28._10_2_ = uStack_1204;
  auVar28._8_2_ = uStack_11f4;
  auVar28._12_2_ = uStack_11f2;
  auVar28._14_2_ = uStack_1202;
  auVar27._8_8_ = uVar98;
  auVar27._0_8_ = uVar97;
  auVar102 = pmaddwd(auVar28,auVar27);
  auVar26._2_2_ = uStack_1100;
  auVar26._0_2_ = uStack_10f0;
  auVar26._4_2_ = uStack_10ee;
  auVar26._6_2_ = uStack_10fe;
  auVar26._10_2_ = uStack_10fc;
  auVar26._8_2_ = uStack_10ec;
  auVar26._12_2_ = uStack_10ea;
  auVar26._14_2_ = uStack_10fa;
  auVar25._8_8_ = uVar98;
  auVar25._0_8_ = uVar97;
  auVar101 = pmaddwd(auVar26,auVar25);
  auVar24._2_2_ = local_1208;
  auVar24._0_2_ = local_11f8;
  auVar24._4_2_ = uStack_11f6;
  auVar24._6_2_ = uStack_1206;
  auVar24._10_2_ = uStack_1204;
  auVar24._8_2_ = uStack_11f4;
  auVar24._12_2_ = uStack_11f2;
  auVar24._14_2_ = uStack_1202;
  auVar23._8_8_ = uVar94;
  auVar23._0_8_ = uVar93;
  auVar103 = pmaddwd(auVar24,auVar23);
  auVar22._2_2_ = uStack_1100;
  auVar22._0_2_ = uStack_10f0;
  auVar22._4_2_ = uStack_10ee;
  auVar22._6_2_ = uStack_10fe;
  auVar22._10_2_ = uStack_10fc;
  auVar22._8_2_ = uStack_10ec;
  auVar22._12_2_ = uStack_10ea;
  auVar22._14_2_ = uStack_10fa;
  auVar21._8_8_ = uVar94;
  auVar21._0_8_ = uVar93;
  auVar104 = pmaddwd(auVar22,auVar21);
  local_a78 = auVar102._0_4_;
  uStack_a74 = auVar102._4_4_;
  uStack_a70 = auVar102._8_4_;
  uStack_a6c = auVar102._12_4_;
  local_a98 = auVar101._0_4_;
  uStack_a94 = auVar101._4_4_;
  uStack_a90 = auVar101._8_4_;
  uStack_a8c = auVar101._12_4_;
  local_ab8 = auVar103._0_4_;
  uStack_ab4 = auVar103._4_4_;
  uStack_ab0 = auVar103._8_4_;
  uStack_aac = auVar103._12_4_;
  local_ad8 = auVar104._0_4_;
  uStack_ad4 = auVar104._4_4_;
  uStack_ad0 = auVar104._8_4_;
  uStack_acc = auVar104._12_4_;
  auVar102 = ZEXT416((uint)(int)in_DL);
  auVar101 = ZEXT416((uint)(int)in_DL);
  auVar103 = ZEXT416((uint)(int)in_DL);
  auVar104 = ZEXT416((uint)(int)in_DL);
  auVar76._4_4_ = uStack_a74 + uStack_884 >> auVar102;
  auVar76._0_4_ = local_a78 + local_888 >> auVar102;
  auVar76._12_4_ = uStack_a6c + uStack_87c >> auVar102;
  auVar76._8_4_ = uStack_a70 + uStack_880 >> auVar102;
  auVar75._4_4_ = uStack_a94 + uStack_884 >> auVar101;
  auVar75._0_4_ = local_a98 + local_888 >> auVar101;
  auVar75._12_4_ = uStack_a8c + uStack_87c >> auVar101;
  auVar75._8_4_ = uStack_a90 + uStack_880 >> auVar101;
  auVar102 = packssdw(auVar76,auVar75);
  *(undefined1 (*) [16])(in_RDI + 0x280) = auVar102;
  auVar74._4_4_ = uStack_ab4 + uStack_884 >> auVar103;
  auVar74._0_4_ = local_ab8 + local_888 >> auVar103;
  auVar74._12_4_ = uStack_aac + uStack_87c >> auVar103;
  auVar74._8_4_ = uStack_ab0 + uStack_880 >> auVar103;
  auVar73._4_4_ = uStack_ad4 + uStack_884 >> auVar104;
  auVar73._0_4_ = local_ad8 + local_888 >> auVar104;
  auVar73._12_4_ = uStack_acc + uStack_87c >> auVar104;
  auVar73._8_4_ = uStack_ad0 + uStack_880 >> auVar104;
  auVar102 = packssdw(auVar74,auVar73);
  *(undefined1 (*) [16])(in_RDI + 0x370) = auVar102;
  uVar1 = *(undefined8 *)(in_RDI + 0x290);
  uVar2 = *(undefined8 *)(in_RDI + 0x360);
  local_1218 = (undefined2)uVar1;
  uStack_1216 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_1214 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_1212 = (undefined2)((ulong)uVar1 >> 0x30);
  local_1228 = (undefined2)uVar2;
  uStack_1226 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_1224 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_1222 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *(undefined8 *)(in_RDI + 0x298);
  uVar2 = *(undefined8 *)(in_RDI + 0x368);
  uStack_1110 = (undefined2)uVar1;
  uStack_110e = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_110c = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_110a = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_1120 = (undefined2)uVar2;
  uStack_111e = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_111c = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_111a = (undefined2)((ulong)uVar2 >> 0x30);
  auVar20._2_2_ = local_1228;
  auVar20._0_2_ = local_1218;
  auVar20._4_2_ = uStack_1216;
  auVar20._6_2_ = uStack_1226;
  auVar20._10_2_ = uStack_1224;
  auVar20._8_2_ = uStack_1214;
  auVar20._12_2_ = uStack_1212;
  auVar20._14_2_ = uStack_1222;
  auVar19._8_8_ = uVar98;
  auVar19._0_8_ = uVar97;
  auVar102 = pmaddwd(auVar20,auVar19);
  auVar18._2_2_ = uStack_1120;
  auVar18._0_2_ = uStack_1110;
  auVar18._4_2_ = uStack_110e;
  auVar18._6_2_ = uStack_111e;
  auVar18._10_2_ = uStack_111c;
  auVar18._8_2_ = uStack_110c;
  auVar18._12_2_ = uStack_110a;
  auVar18._14_2_ = uStack_111a;
  auVar17._8_8_ = uVar98;
  auVar17._0_8_ = uVar97;
  auVar101 = pmaddwd(auVar18,auVar17);
  auVar16._2_2_ = local_1228;
  auVar16._0_2_ = local_1218;
  auVar16._4_2_ = uStack_1216;
  auVar16._6_2_ = uStack_1226;
  auVar16._10_2_ = uStack_1224;
  auVar16._8_2_ = uStack_1214;
  auVar16._12_2_ = uStack_1212;
  auVar16._14_2_ = uStack_1222;
  auVar15._8_8_ = uVar94;
  auVar15._0_8_ = uVar93;
  auVar103 = pmaddwd(auVar16,auVar15);
  auVar14._2_2_ = uStack_1120;
  auVar14._0_2_ = uStack_1110;
  auVar14._4_2_ = uStack_110e;
  auVar14._6_2_ = uStack_111e;
  auVar14._10_2_ = uStack_111c;
  auVar14._8_2_ = uStack_110c;
  auVar14._12_2_ = uStack_110a;
  auVar14._14_2_ = uStack_111a;
  auVar13._8_8_ = uVar94;
  auVar13._0_8_ = uVar93;
  auVar104 = pmaddwd(auVar14,auVar13);
  local_af8 = auVar102._0_4_;
  uStack_af4 = auVar102._4_4_;
  uStack_af0 = auVar102._8_4_;
  uStack_aec = auVar102._12_4_;
  local_b18 = auVar101._0_4_;
  uStack_b14 = auVar101._4_4_;
  uStack_b10 = auVar101._8_4_;
  uStack_b0c = auVar101._12_4_;
  local_b38 = auVar103._0_4_;
  uStack_b34 = auVar103._4_4_;
  uStack_b30 = auVar103._8_4_;
  uStack_b2c = auVar103._12_4_;
  local_b58 = auVar104._0_4_;
  uStack_b54 = auVar104._4_4_;
  uStack_b50 = auVar104._8_4_;
  uStack_b4c = auVar104._12_4_;
  auVar102 = ZEXT416((uint)(int)in_DL);
  auVar101 = ZEXT416((uint)(int)in_DL);
  auVar103 = ZEXT416((uint)(int)in_DL);
  auVar104 = ZEXT416((uint)(int)in_DL);
  auVar72._4_4_ = uStack_af4 + uStack_884 >> auVar102;
  auVar72._0_4_ = local_af8 + local_888 >> auVar102;
  auVar72._12_4_ = uStack_aec + uStack_87c >> auVar102;
  auVar72._8_4_ = uStack_af0 + uStack_880 >> auVar102;
  auVar71._4_4_ = uStack_b14 + uStack_884 >> auVar101;
  auVar71._0_4_ = local_b18 + local_888 >> auVar101;
  auVar71._12_4_ = uStack_b0c + uStack_87c >> auVar101;
  auVar71._8_4_ = uStack_b10 + uStack_880 >> auVar101;
  auVar102 = packssdw(auVar72,auVar71);
  *(undefined1 (*) [16])(in_RDI + 0x290) = auVar102;
  auVar70._4_4_ = uStack_b34 + uStack_884 >> auVar103;
  auVar70._0_4_ = local_b38 + local_888 >> auVar103;
  auVar70._12_4_ = uStack_b2c + uStack_87c >> auVar103;
  auVar70._8_4_ = uStack_b30 + uStack_880 >> auVar103;
  auVar69._4_4_ = uStack_b54 + uStack_884 >> auVar104;
  auVar69._0_4_ = local_b58 + local_888 >> auVar104;
  auVar69._12_4_ = uStack_b4c + uStack_87c >> auVar104;
  auVar69._8_4_ = uStack_b50 + uStack_880 >> auVar104;
  auVar102 = packssdw(auVar70,auVar69);
  *(undefined1 (*) [16])(in_RDI + 0x360) = auVar102;
  uVar1 = *(undefined8 *)(in_RDI + 0x2a0);
  uVar2 = *(undefined8 *)(in_RDI + 0x350);
  local_1238 = (undefined2)uVar1;
  uStack_1236 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_1234 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_1232 = (undefined2)((ulong)uVar1 >> 0x30);
  local_1248 = (undefined2)uVar2;
  uStack_1246 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_1244 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_1242 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *(undefined8 *)(in_RDI + 0x2a8);
  uVar2 = *(undefined8 *)(in_RDI + 0x358);
  uStack_1130 = (undefined2)uVar1;
  uStack_112e = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_112c = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_112a = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_1140 = (undefined2)uVar2;
  uStack_113e = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_113c = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_113a = (undefined2)((ulong)uVar2 >> 0x30);
  auVar12._2_2_ = local_1248;
  auVar12._0_2_ = local_1238;
  auVar12._4_2_ = uStack_1236;
  auVar12._6_2_ = uStack_1246;
  auVar12._10_2_ = uStack_1244;
  auVar12._8_2_ = uStack_1234;
  auVar12._12_2_ = uStack_1232;
  auVar12._14_2_ = uStack_1242;
  auVar11._8_8_ = uVar98;
  auVar11._0_8_ = uVar97;
  auVar102 = pmaddwd(auVar12,auVar11);
  auVar10._2_2_ = uStack_1140;
  auVar10._0_2_ = uStack_1130;
  auVar10._4_2_ = uStack_112e;
  auVar10._6_2_ = uStack_113e;
  auVar10._10_2_ = uStack_113c;
  auVar10._8_2_ = uStack_112c;
  auVar10._12_2_ = uStack_112a;
  auVar10._14_2_ = uStack_113a;
  auVar9._8_8_ = uVar98;
  auVar9._0_8_ = uVar97;
  auVar101 = pmaddwd(auVar10,auVar9);
  auVar8._2_2_ = local_1248;
  auVar8._0_2_ = local_1238;
  auVar8._4_2_ = uStack_1236;
  auVar8._6_2_ = uStack_1246;
  auVar8._10_2_ = uStack_1244;
  auVar8._8_2_ = uStack_1234;
  auVar8._12_2_ = uStack_1232;
  auVar8._14_2_ = uStack_1242;
  auVar7._8_8_ = uVar94;
  auVar7._0_8_ = uVar93;
  auVar103 = pmaddwd(auVar8,auVar7);
  auVar6._2_2_ = uStack_1140;
  auVar6._0_2_ = uStack_1130;
  auVar6._4_2_ = uStack_112e;
  auVar6._6_2_ = uStack_113e;
  auVar6._10_2_ = uStack_113c;
  auVar6._8_2_ = uStack_112c;
  auVar6._12_2_ = uStack_112a;
  auVar6._14_2_ = uStack_113a;
  auVar5._8_8_ = uVar94;
  auVar5._0_8_ = uVar93;
  auVar104 = pmaddwd(auVar6,auVar5);
  local_b78 = auVar102._0_4_;
  uStack_b74 = auVar102._4_4_;
  uStack_b70 = auVar102._8_4_;
  uStack_b6c = auVar102._12_4_;
  local_b98 = auVar101._0_4_;
  uStack_b94 = auVar101._4_4_;
  uStack_b90 = auVar101._8_4_;
  uStack_b8c = auVar101._12_4_;
  local_bb8 = auVar103._0_4_;
  uStack_bb4 = auVar103._4_4_;
  uStack_bb0 = auVar103._8_4_;
  uStack_bac = auVar103._12_4_;
  local_bd8 = auVar104._0_4_;
  uStack_bd4 = auVar104._4_4_;
  uStack_bd0 = auVar104._8_4_;
  uStack_bcc = auVar104._12_4_;
  auVar102 = ZEXT416((uint)(int)in_DL);
  auVar101 = ZEXT416((uint)(int)in_DL);
  auVar103 = ZEXT416((uint)(int)in_DL);
  auVar104 = ZEXT416((uint)(int)in_DL);
  auVar68._4_4_ = uStack_b74 + uStack_884 >> auVar102;
  auVar68._0_4_ = local_b78 + local_888 >> auVar102;
  auVar68._12_4_ = uStack_b6c + uStack_87c >> auVar102;
  auVar68._8_4_ = uStack_b70 + uStack_880 >> auVar102;
  auVar67._4_4_ = uStack_b94 + uStack_884 >> auVar101;
  auVar67._0_4_ = local_b98 + local_888 >> auVar101;
  auVar67._12_4_ = uStack_b8c + uStack_87c >> auVar101;
  auVar67._8_4_ = uStack_b90 + uStack_880 >> auVar101;
  auVar102 = packssdw(auVar68,auVar67);
  *(undefined1 (*) [16])(in_RDI + 0x2a0) = auVar102;
  auVar66._4_4_ = uStack_bb4 + uStack_884 >> auVar103;
  auVar66._0_4_ = local_bb8 + local_888 >> auVar103;
  auVar66._12_4_ = uStack_bac + uStack_87c >> auVar103;
  auVar66._8_4_ = uStack_bb0 + uStack_880 >> auVar103;
  auVar65._4_4_ = uStack_bd4 + uStack_884 >> auVar104;
  auVar65._0_4_ = local_bd8 + local_888 >> auVar104;
  auVar65._12_4_ = uStack_bcc + uStack_87c >> auVar104;
  auVar65._8_4_ = uStack_bd0 + uStack_880 >> auVar104;
  auVar102 = packssdw(auVar66,auVar65);
  *(undefined1 (*) [16])(in_RDI + 0x350) = auVar102;
  uVar1 = *(undefined8 *)(in_RDI + 0x2b0);
  uVar2 = *(undefined8 *)(in_RDI + 0x340);
  local_1258 = (undefined2)uVar1;
  uStack_1256 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_1254 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_1252 = (undefined2)((ulong)uVar1 >> 0x30);
  local_1268 = (undefined2)uVar2;
  uStack_1266 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_1264 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_1262 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *(undefined8 *)(in_RDI + 0x2b8);
  uVar2 = *(undefined8 *)(in_RDI + 0x348);
  uStack_1150 = (undefined2)uVar1;
  uStack_114e = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_114c = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_114a = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_1160 = (undefined2)uVar2;
  uStack_115e = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_115c = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_115a = (undefined2)((ulong)uVar2 >> 0x30);
  auVar4._2_2_ = local_1268;
  auVar4._0_2_ = local_1258;
  auVar4._4_2_ = uStack_1256;
  auVar4._6_2_ = uStack_1266;
  auVar4._10_2_ = uStack_1264;
  auVar4._8_2_ = uStack_1254;
  auVar4._12_2_ = uStack_1252;
  auVar4._14_2_ = uStack_1262;
  auVar105._8_8_ = uVar98;
  auVar105._0_8_ = uVar97;
  auVar105 = pmaddwd(auVar4,auVar105);
  auVar3._2_2_ = uStack_1160;
  auVar3._0_2_ = uStack_1150;
  auVar3._4_2_ = uStack_114e;
  auVar3._6_2_ = uStack_115e;
  auVar3._10_2_ = uStack_115c;
  auVar3._8_2_ = uStack_114c;
  auVar3._12_2_ = uStack_114a;
  auVar3._14_2_ = uStack_115a;
  auVar106._8_8_ = uVar98;
  auVar106._0_8_ = uVar97;
  auVar106 = pmaddwd(auVar3,auVar106);
  auVar104._2_2_ = local_1268;
  auVar104._0_2_ = local_1258;
  auVar104._4_2_ = uStack_1256;
  auVar104._6_2_ = uStack_1266;
  auVar104._10_2_ = uStack_1264;
  auVar104._8_2_ = uStack_1254;
  auVar104._12_2_ = uStack_1252;
  auVar104._14_2_ = uStack_1262;
  auVar103._8_8_ = uVar94;
  auVar103._0_8_ = uVar93;
  auVar103 = pmaddwd(auVar104,auVar103);
  auVar101._2_2_ = uStack_1160;
  auVar101._0_2_ = uStack_1150;
  auVar101._4_2_ = uStack_114e;
  auVar101._6_2_ = uStack_115e;
  auVar101._10_2_ = uStack_115c;
  auVar101._8_2_ = uStack_114c;
  auVar101._12_2_ = uStack_114a;
  auVar101._14_2_ = uStack_115a;
  auVar102._8_8_ = uVar94;
  auVar102._0_8_ = uVar93;
  auVar102 = pmaddwd(auVar101,auVar102);
  local_bf8 = auVar105._0_4_;
  uStack_bf4 = auVar105._4_4_;
  uStack_bf0 = auVar105._8_4_;
  uStack_bec = auVar105._12_4_;
  local_c18 = auVar106._0_4_;
  uStack_c14 = auVar106._4_4_;
  uStack_c10 = auVar106._8_4_;
  uStack_c0c = auVar106._12_4_;
  local_c38 = auVar103._0_4_;
  uStack_c34 = auVar103._4_4_;
  uStack_c30 = auVar103._8_4_;
  uStack_c2c = auVar103._12_4_;
  local_c58 = auVar102._0_4_;
  uStack_c54 = auVar102._4_4_;
  uStack_c50 = auVar102._8_4_;
  uStack_c4c = auVar102._12_4_;
  auVar102 = ZEXT416((uint)(int)in_DL);
  auVar101 = ZEXT416((uint)(int)in_DL);
  auVar103 = ZEXT416((uint)(int)in_DL);
  auVar104 = ZEXT416((uint)(int)in_DL);
  auVar64._4_4_ = uStack_bf4 + uStack_884 >> auVar102;
  auVar64._0_4_ = local_bf8 + local_888 >> auVar102;
  auVar64._12_4_ = uStack_bec + uStack_87c >> auVar102;
  auVar64._8_4_ = uStack_bf0 + uStack_880 >> auVar102;
  auVar63._4_4_ = uStack_c14 + uStack_884 >> auVar101;
  auVar63._0_4_ = local_c18 + local_888 >> auVar101;
  auVar63._12_4_ = uStack_c0c + uStack_87c >> auVar101;
  auVar63._8_4_ = uStack_c10 + uStack_880 >> auVar101;
  auVar102 = packssdw(auVar64,auVar63);
  *(undefined1 (*) [16])(in_RDI + 0x2b0) = auVar102;
  auVar62._4_4_ = uStack_c34 + uStack_884 >> auVar103;
  auVar62._0_4_ = local_c38 + local_888 >> auVar103;
  auVar62._12_4_ = uStack_c2c + uStack_87c >> auVar103;
  auVar62._8_4_ = uStack_c30 + uStack_880 >> auVar103;
  auVar61._4_4_ = uStack_c54 + uStack_884 >> auVar104;
  auVar61._0_4_ = local_c58 + local_888 >> auVar104;
  auVar61._12_4_ = uStack_c4c + uStack_87c >> auVar104;
  auVar61._8_4_ = uStack_c50 + uStack_880 >> auVar104;
  auVar102 = packssdw(auVar62,auVar61);
  *(undefined1 (*) [16])(in_RDI + 0x340) = auVar102;
  return;
}

Assistant:

static inline void idct64_stage8_high48_sse2(__m128i *x, const int32_t *cospi,
                                             const __m128i __rounding,
                                             int8_t cos_bit) {
  const __m128i cospi_m16_p48 = pair_set_epi16(-cospi[16], cospi[48]);
  const __m128i cospi_p48_p16 = pair_set_epi16(cospi[48], cospi[16]);
  const __m128i cospi_m48_m16 = pair_set_epi16(-cospi[48], -cospi[16]);
  btf_16_adds_subs_sse2(x[16], x[23]);
  btf_16_adds_subs_sse2(x[17], x[22]);
  btf_16_adds_subs_sse2(x[18], x[21]);
  btf_16_adds_subs_sse2(x[19], x[20]);
  btf_16_subs_adds_sse2(x[31], x[24]);
  btf_16_subs_adds_sse2(x[30], x[25]);
  btf_16_subs_adds_sse2(x[29], x[26]);
  btf_16_subs_adds_sse2(x[28], x[27]);
  btf_16_sse2(cospi_m16_p48, cospi_p48_p16, x[36], x[59], x[36], x[59]);
  btf_16_sse2(cospi_m16_p48, cospi_p48_p16, x[37], x[58], x[37], x[58]);
  btf_16_sse2(cospi_m16_p48, cospi_p48_p16, x[38], x[57], x[38], x[57]);
  btf_16_sse2(cospi_m16_p48, cospi_p48_p16, x[39], x[56], x[39], x[56]);
  btf_16_sse2(cospi_m48_m16, cospi_m16_p48, x[40], x[55], x[40], x[55]);
  btf_16_sse2(cospi_m48_m16, cospi_m16_p48, x[41], x[54], x[41], x[54]);
  btf_16_sse2(cospi_m48_m16, cospi_m16_p48, x[42], x[53], x[42], x[53]);
  btf_16_sse2(cospi_m48_m16, cospi_m16_p48, x[43], x[52], x[43], x[52]);
}